

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

boolean create_particular(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  permonst *ptr;
  monst *mtmp;
  int iVar6;
  int iVar7;
  boolean bVar8;
  byte bVar9;
  bool bVar10;
  int local_158;
  int local_13c;
  char buf [256];
  
  local_158 = 0x3d;
  iVar7 = 5;
  do {
    lVar4 = 5;
    iVar6 = (int)urole.malenum;
    getlin("Create what kind of monster? [type the name or symbol]",buf);
    pcVar3 = mungspaces(buf);
    if (*pcVar3 == '\x1b') {
      return '\0';
    }
    iVar1 = strncasecmp(pcVar3,"tame ",5);
    if (iVar1 == 0) {
      bVar9 = 0;
      bVar10 = false;
    }
    else {
      iVar2 = strncasecmp(pcVar3,"peaceful ",9);
      if (iVar2 == 0) {
        bVar10 = false;
        bVar9 = 1;
        lVar4 = 9;
      }
      else {
        iVar2 = strncasecmp(pcVar3,"hostile ",8);
        bVar10 = iVar2 == 0;
        bVar9 = 0;
        lVar4 = (ulong)bVar10 << 3;
      }
    }
    pcVar3 = pcVar3 + lVar4;
    sVar5 = strlen(pcVar3);
    if (sVar5 == 1) {
      local_158 = def_char_to_monclass(*pcVar3);
      if ((char)local_158 != '=') {
LAB_0022270a:
        iVar7 = 0;
        local_13c = iVar6;
        cant_create(&local_13c,'\0');
        ptr = mons + local_13c;
        bVar8 = '\0';
        break;
      }
    }
    else {
      iVar6 = name_to_mon(pcVar3);
      if (-1 < iVar6) goto LAB_0022270a;
    }
    pline("I\'ve never heard of such monsters.");
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      pline("That\'s enough tries!");
      return '\0';
    }
  } while( true );
LAB_0022275d:
  if (multi < iVar7) {
    return bVar8;
  }
  if ((char)local_158 != '=') {
    ptr = mkclass(&u.uz,(char)local_158,0);
  }
  if (iVar1 == 0) {
    mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,4);
    if (mtmp != (monst *)0x0) {
      initedog(mtmp);
      goto LAB_002227eb;
    }
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
    if ((mtmp != (monst *)0x0 & (bVar10 | bVar9)) == 1) {
      mtmp->mtame = '\0';
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | (uint)bVar9 << 0x16;
LAB_002227eb:
      set_malign(mtmp);
    }
  }
  if (mtmp != (monst *)0x0) {
    bVar8 = '\x01';
  }
  iVar7 = iVar7 + 1;
  goto LAB_0022275d;
}

Assistant:

boolean create_particular(void)
{
	char buf[BUFSZ], *bufp, monclass = MAXMCLASSES;
	int which, tries, i;
	const struct permonst *whichpm;
	struct monst *mtmp;
	boolean madeany = FALSE;
	boolean maketame, makepeaceful, makehostile;

	tries = 0;
	do {
	    which = urole.malenum;	/* an arbitrary index into mons[] */
	    maketame = makepeaceful = makehostile = FALSE;
	    getlin("Create what kind of monster? [type the name or symbol]",
		   buf);
	    bufp = mungspaces(buf);
	    if (*bufp == '\033') return FALSE;
	    /* allow the initial disposition to be specified */
	    if (!strncmpi(bufp, "tame ", 5)) {
		bufp += 5;
		maketame = TRUE;
	    } else if (!strncmpi(bufp, "peaceful ", 9)) {
		bufp += 9;
		makepeaceful = TRUE;
	    } else if (!strncmpi(bufp, "hostile ", 8)) {
		bufp += 8;
		makehostile = TRUE;
	    }
	    /* decide whether a valid monster was chosen */
	    if (strlen(bufp) == 1) {
		monclass = def_char_to_monclass(*bufp);
		if (monclass != MAXMCLASSES) break;	/* got one */
	    } else {
		which = name_to_mon(bufp);
		if (which >= LOW_PM) break;		/* got one */
	    }
	    /* no good; try again... */
	    pline("I've never heard of such monsters.");
	} while (++tries < 5);

	if (tries == 5) {
	    pline("That's enough tries!");
	} else {
	    cant_create(&which, FALSE);
	    whichpm = &mons[which];
	    for (i = 0; i <= multi; i++) {
		if (monclass != MAXMCLASSES)
		    whichpm = mkclass(&u.uz, monclass, 0);
		if (maketame) {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, MM_EDOG);
		    if (mtmp) {
			initedog(mtmp);
			set_malign(mtmp);
		    }
		} else {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, NO_MM_FLAGS);
		    if ((makepeaceful || makehostile) && mtmp) {
			mtmp->mtame = 0;	/* sanity precaution */
			mtmp->mpeaceful = makepeaceful ? 1 : 0;
			set_malign(mtmp);
		    }
		}
		if (mtmp) madeany = TRUE;
	    }
	}
	return madeany;
}